

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O1

void __thiscall DetectorSS::Update(DetectorSS *this,key_tp src,key_tp dst,val_tp weight)

{
  byte *pbVar1;
  int *piVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint32_t hashval [4];
  uint32_t key [3];
  key_tp local_5c;
  uint local_58 [4];
  undefined8 local_48;
  key_tp local_3c;
  key_tp local_38;
  key_tp local_34;
  
  local_48 = CONCAT44(src,dst);
  iVar9 = (this->ss_).lgn;
  iVar11 = iVar9 + 7;
  if (-1 < iVar9) {
    iVar11 = iVar9;
  }
  local_5c = src;
  uVar4 = MurmurHash64A(&local_48,(iVar11 >> 3) * 2,*(this->ss_).hash);
  iVar9 = 0;
  if ((uVar4 & 1) != 0) {
    iVar9 = 0;
    uVar5 = uVar4;
    do {
      iVar9 = iVar9 + 1;
      uVar7 = uVar5 & 2;
      uVar5 = uVar5 >> 1;
    } while (uVar7 != 0);
  }
  local_3c = local_5c;
  local_38 = local_5c;
  local_34 = local_5c;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  MurmurHash3_x64_128(&local_3c,0xc,(uint32_t)*(this->ss_).hash,local_58);
  iVar3 = (this->ss_).c + -1;
  iVar11 = iVar3;
  if (iVar9 < iVar3) {
    iVar11 = iVar9;
  }
  iVar11 = (int)((long)(&(this->ss_).b)[(ulong)(iVar3 <= iVar9) * 2] * (uVar4 & 0xffffffff) >> 0x20)
           + (this->ss_).offsets[iVar11];
  if (0 < (this->ss_).tdepth) {
    lVar6 = 0;
    do {
      uVar7 = (long)(this->ss_).width * (ulong)local_58[lVar6];
      uVar8 = uVar7 >> 0x20;
      piVar2 = (this->ss_).level[lVar6];
      if (piVar2[uVar8] < iVar9) {
        piVar2[uVar8] = iVar9;
        (this->ss_).skey[lVar6][uVar8] = local_5c;
      }
      iVar3 = (int)(uVar7 >> 0x20) * (this->ss_).offsets[(this->ss_).c] + iVar11;
      pbVar1 = (this->ss_).counts[lVar6] + (iVar3 >> 3);
      *pbVar1 = *pbVar1 | (byte)(0x80 >> ((byte)iVar3 & 7));
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->ss_).tdepth);
  }
  if (4 < (this->ss_).depth) {
    lVar6 = 4;
    do {
      iVar3 = (this->ss_).lgn;
      iVar10 = iVar3 + 7;
      if (-1 < iVar3) {
        iVar10 = iVar3;
      }
      uVar4 = MurmurHash64A(&local_5c,iVar10 >> 3,(this->ss_).hash[lVar6]);
      uVar7 = (long)(this->ss_).width * (uVar4 & 0xffffffff);
      uVar8 = uVar7 >> 0x20;
      piVar2 = (this->ss_).level[lVar6];
      if (piVar2[uVar8] < iVar9) {
        piVar2[uVar8] = iVar9;
        (this->ss_).skey[lVar6][uVar8] = local_5c;
      }
      iVar3 = (int)(uVar7 >> 0x20) * (this->ss_).offsets[(this->ss_).c] + iVar11;
      pbVar1 = (this->ss_).counts[lVar6] + (iVar3 >> 3);
      *pbVar1 = *pbVar1 | (byte)(0x80 >> ((byte)iVar3 & 7));
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->ss_).depth);
  }
  return;
}

Assistant:

void DetectorSS::Update(key_tp src, key_tp dst, val_tp weight) {
	unsigned long edge = src;
	edge = (edge << 32) | dst;
	int tmplevel = 0;
	//Update sketch
	unsigned long p = MurmurHash64A((unsigned char*)(&edge), ss_.lgn / 8 * 2, ss_.hash[0]);
#ifdef HH
	//check if HH
	int index = p & ss_.mask;
	if (ss_.key[index] == edge) {
		ss_.indicator[index]++;
		return;
	}
	else {
		ss_.indicator[index]--;
		if (ss_.indicator[index] < 0) {
			ss_.key[index] = edge;
			ss_.indicator[index] = 1;
		}
	}
#endif
	tmplevel = loghash(p);
	unsigned bucket = 0;
	uint32_t key[3] = { src, src, src };
	uint32_t hashval[4] = { 0 };
	MurmurHash3_x64_128((unsigned char*)key, 12, ss_.hash[0], (unsigned char*)hashval);
	int pos = 0;
	if (tmplevel < ss_.c - 1) {
		pos = (((uint32_t)p * ((uint64_t)ss_.b)) >> 32);
		pos += ss_.offsets[tmplevel];
	}
	else {
		pos = (((uint32_t)p * (uint64_t)ss_.lastb) >> 32);
		pos += ss_.offsets[ss_.c - 1];
	}

	for (int i = 0; i < ss_.tdepth; i++) {
		bucket = (hashval[i] * (unsigned long)ss_.width) >> 32;
		if (ss_.level[i][bucket] < tmplevel) {
			ss_.level[i][bucket] = tmplevel;
			ss_.skey[i][bucket] = src;
		}
		//Update distinct counter
		Setbit(pos, bucket, ss_.counts[i]);
	}

	for (int i = 4; i < ss_.depth; i++) {
		bucket = MurmurHash64A((unsigned char*)(&src), ss_.lgn / 8, ss_.hash[i]);
		bucket = (bucket * (unsigned long)ss_.width) >> 32;
		if (ss_.level[i][bucket] < tmplevel) {
			ss_.level[i][bucket] = tmplevel;
			ss_.skey[i][bucket] = src;
		}
		Setbit(pos, bucket, ss_.counts[i]);
	}
}